

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

SignalEventControl * __thiscall
slang::BumpAllocator::
emplace<slang::ast::SignalEventControl,slang::ast::EdgeKind_const&,slang::ast::Expression_const&,slang::ast::Expression_const*const&,slang::SourceRange_const&>
          (BumpAllocator *this,EdgeKind *args,Expression *args_1,Expression **args_2,
          SourceRange *args_3)

{
  EdgeKind EVar1;
  Expression *pEVar2;
  SourceLocation SVar3;
  SourceLocation SVar4;
  SignalEventControl *pSVar5;
  
  pSVar5 = (SignalEventControl *)allocate(this,0x38,8);
  EVar1 = *args;
  pEVar2 = *args_2;
  SVar3 = args_3->startLoc;
  SVar4 = args_3->endLoc;
  (pSVar5->super_TimingControl).kind = SignalEvent;
  (pSVar5->super_TimingControl).syntax = (SyntaxNode *)0x0;
  (pSVar5->super_TimingControl).sourceRange.startLoc = SVar3;
  (pSVar5->super_TimingControl).sourceRange.endLoc = SVar4;
  pSVar5->expr = args_1;
  pSVar5->iffCondition = pEVar2;
  pSVar5->edge = EVar1;
  return pSVar5;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }